

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::BaseRAPass::blockEntryAssigned(BaseRAPass *this,PhysToWorkMap *physToWorkMap)

{
  uint *puVar1;
  byte bVar2;
  uint32_t uVar3;
  long lVar4;
  BaseCompiler *this_00;
  uint uVar5;
  Error EVar6;
  undefined8 extraout_RAX;
  uint uVar7;
  uint alignment;
  uint32_t size;
  uint32_t newSize;
  long lVar8;
  
  uVar5 = *(uint *)&this->field_0x148;
  lVar8 = 0;
  do {
    if (((this->_strategy)._data[lVar8]._type != kSimple) &&
       (uVar7 = (physToWorkMap->assigned)._masks._data[lVar8], uVar7 != 0)) {
      bVar2 = (((RARegIndex *)(&this->_scratchRegIndexes + -6))->super_RARegCount).field_0._regs
              [lVar8];
      lVar4 = *(long *)&this->_workRegs;
      do {
        alignment = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> alignment & 1) == 0; alignment = alignment + 1) {
          }
        }
        if (uVar5 <= physToWorkMap->workIds[alignment + bVar2]) {
          blockEntryAssigned();
          if (alignment < 0x41) {
            uVar5 = (this->_temporaryMem).super_Operand_._signature._bits;
            if (uVar5 == 0) {
              EVar6 = BaseCompiler::_newStack
                                ((BaseCompiler *)(this->super_FuncPass).super_Pass._cb,
                                 (BaseMem *)&this->_temporaryMem,size,alignment,(char *)0x0);
              if (EVar6 != 0) {
                return EVar6;
              }
LAB_0012a636:
              uVar3 = (this->_temporaryMem).super_Operand_._baseId;
              (physToWorkMap->assigned)._masks._data[0] =
                   (this->_temporaryMem).super_Operand_._signature._bits;
              (physToWorkMap->assigned)._masks._data[1] = uVar3;
              (physToWorkMap->assigned)._masks._data[2] =
                   (this->_temporaryMem).super_Operand_._data[0];
              (physToWorkMap->assigned)._masks._data[3] =
                   (this->_temporaryMem).super_Operand_._data[1];
              return 0;
            }
            if ((uVar5 >> 0xd & 1) != 0) {
              uVar3 = (this->_temporaryMem).super_Operand_._baseId;
              this_00 = (BaseCompiler *)(this->super_FuncPass).super_Pass._cb;
              uVar5 = uVar3 - 0x100;
              if (uVar5 < *(uint *)&this_00->field_0x1f0) {
                lVar8 = *(long *)(*(long *)&this_00->_vRegArray + (ulong)uVar5 * 8);
                uVar5 = *(uint *)(lVar8 + 8);
                newSize = size;
                if (size < uVar5) {
                  newSize = uVar5;
                }
                uVar5 = (uint)*(byte *)(lVar8 + 0xc);
                if (alignment < uVar5) {
                  alignment = uVar5;
                }
                BaseCompiler::setStackSize(this_00,uVar3,newSize,alignment);
                goto LAB_0012a636;
              }
              goto LAB_0012a681;
            }
          }
          else {
            useTemporaryMem();
          }
          useTemporaryMem();
LAB_0012a681:
          useTemporaryMem();
          __clang_call_terminate(extraout_RAX);
        }
        puVar1 = (uint *)(*(long *)(lVar4 + (ulong)physToWorkMap->workIds[alignment + bVar2] * 8) +
                         0x3c);
        *puVar1 = *puVar1 | 1 << ((byte)alignment & 0x1f);
        uVar7 = uVar7 - 1 & uVar7;
      } while (uVar7 != 0);
    }
    lVar8 = lVar8 + 1;
    if (lVar8 == 4) {
      return 0;
    }
  } while( true );
}

Assistant:

Error BaseRAPass::blockEntryAssigned(const PhysToWorkMap* physToWorkMap) noexcept {
  // Complex allocation strategy requires to record register assignments upon block entry (or per shared state).
  for (RegGroup group : RegGroupVirtValues{}) {
    if (!_strategy[group].isComplex())
      continue;

    uint32_t physBaseIndex = _physRegIndex[group];
    Support::BitWordIterator<RegMask> it(physToWorkMap->assigned[group]);

    while (it.hasNext()) {
      uint32_t physId = it.next();
      uint32_t workId = physToWorkMap->workIds[physBaseIndex + physId];

      RAWorkReg* workReg = workRegById(workId);
      workReg->addAllocatedMask(Support::bitMask(physId));
    }
  }

  return kErrorOk;
}